

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_binsr_h_mipsel(CPUMIPSState_conflict4 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  sbyte sVar1;
  short sVar2;
  fpr_t *pfVar3;
  ushort uVar4;
  
  pfVar3 = (env->active_fpu).fpr + wd;
  uVar4 = *(ushort *)((env->active_fpu).fpr + ws);
  sVar2 = (*(ushort *)((env->active_fpu).fpr + wt) & 0xf) + 1;
  if (sVar2 != 0x10) {
    sVar1 = (sbyte)sVar2;
    uVar4 = (ushort)(0xffff >> (0x10U - sVar1 & 0x1f)) & uVar4 |
            (ushort)((pfVar3->fs[0] >> sVar1) << sVar1);
  }
  *(ushort *)pfVar3 = uVar4;
  uVar4 = *(ushort *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 2);
  sVar2 = (*(ushort *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 2) & 0xf) + 1;
  if (sVar2 != 0x10) {
    sVar1 = (sbyte)sVar2;
    uVar4 = (ushort)(0xffff >> (0x10U - sVar1 & 0x1f)) & uVar4 |
            (*(ushort *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 2) >> sVar1) << sVar1;
  }
  *(ushort *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 2) = uVar4;
  uVar4 = *(ushort *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 4);
  sVar2 = (*(ushort *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 4) & 0xf) + 1;
  if (sVar2 != 0x10) {
    sVar1 = (sbyte)sVar2;
    uVar4 = (ushort)(0xffff >> (0x10U - sVar1 & 0x1f)) & uVar4 |
            (ushort)((*(uint *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 4) >> sVar1) <<
                    sVar1);
  }
  *(ushort *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 4) = uVar4;
  uVar4 = *(ushort *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 6);
  sVar2 = (*(ushort *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 6) & 0xf) + 1;
  if (sVar2 != 0x10) {
    sVar1 = (sbyte)sVar2;
    uVar4 = (ushort)(0xffff >> (0x10U - sVar1 & 0x1f)) & uVar4 |
            (*(ushort *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 6) >> sVar1) << sVar1;
  }
  *(ushort *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 6) = uVar4;
  uVar4 = *(ushort *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
  sVar2 = (*(ushort *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8) & 0xf) + 1;
  if (sVar2 != 0x10) {
    sVar1 = (sbyte)sVar2;
    uVar4 = (ushort)(0xffff >> (0x10U - sVar1 & 0x1f)) & uVar4 |
            (ushort)((*(uint *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) >> sVar1) <<
                    sVar1);
  }
  *(ushort *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = uVar4;
  uVar4 = *(ushort *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 10);
  sVar2 = (*(ushort *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 10) & 0xf) + 1;
  if (sVar2 != 0x10) {
    sVar1 = (sbyte)sVar2;
    uVar4 = (ushort)(0xffff >> (0x10U - sVar1 & 0x1f)) & uVar4 |
            (*(ushort *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 10) >> sVar1) << sVar1;
  }
  *(ushort *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 10) = uVar4;
  uVar4 = *(ushort *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xc);
  sVar2 = (*(ushort *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xc) & 0xf) + 1;
  if (sVar2 != 0x10) {
    sVar1 = (sbyte)sVar2;
    uVar4 = (ushort)(0xffff >> (0x10U - sVar1 & 0x1f)) & uVar4 |
            (ushort)((*(uint *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xc) >> sVar1) <<
                    sVar1);
  }
  *(ushort *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xc) = uVar4;
  uVar4 = *(ushort *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xe);
  sVar2 = (*(ushort *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xe) & 0xf) + 1;
  if (sVar2 != 0x10) {
    sVar1 = (sbyte)sVar2;
    uVar4 = (ushort)(0xffff >> (0x10U - sVar1 & 0x1f)) & uVar4 |
            (*(ushort *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xe) >> sVar1) << sVar1;
  }
  *(ushort *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xe) = uVar4;
  return;
}

Assistant:

void helper_msa_binsr_h(CPUMIPSState *env,
                        uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->h[0]  = msa_binsr_df(DF_HALF, pwd->h[0],  pws->h[0],  pwt->h[0]);
    pwd->h[1]  = msa_binsr_df(DF_HALF, pwd->h[1],  pws->h[1],  pwt->h[1]);
    pwd->h[2]  = msa_binsr_df(DF_HALF, pwd->h[2],  pws->h[2],  pwt->h[2]);
    pwd->h[3]  = msa_binsr_df(DF_HALF, pwd->h[3],  pws->h[3],  pwt->h[3]);
    pwd->h[4]  = msa_binsr_df(DF_HALF, pwd->h[4],  pws->h[4],  pwt->h[4]);
    pwd->h[5]  = msa_binsr_df(DF_HALF, pwd->h[5],  pws->h[5],  pwt->h[5]);
    pwd->h[6]  = msa_binsr_df(DF_HALF, pwd->h[6],  pws->h[6],  pwt->h[6]);
    pwd->h[7]  = msa_binsr_df(DF_HALF, pwd->h[7],  pws->h[7],  pwt->h[7]);
}